

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.hpp
# Opt level: O3

SquareMatrix3<double> * __thiscall
OpenMD::RNEMD::SPFForceManager::linearCombination<OpenMD::SquareMatrix3<double>>
          (SquareMatrix3<double> *__return_storage_ptr__,SPFForceManager *this,
          SquareMatrix3<double> *quantityA,SquareMatrix3<double> *quantityB)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined8 *puVar4;
  long lVar5;
  undefined8 *puVar6;
  double dVar7;
  double dVar8;
  RectMatrix<double,_3U,_3U> result_2;
  RectMatrix<double,_3U,_3U> result_1;
  RectMatrix<double,_3U,_3U> result;
  long local_160;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158 [8];
  undefined8 local_118 [10];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  Snapshot::getSPFData(this->currentSnapshot_);
  dVar7 = pow(*(double *)(local_160 + 0x18),(double)this->k_);
  dVar8 = 1.0;
  if (dVar7 <= 1.0) {
    dVar8 = dVar7;
  }
  dVar8 = (double)(~-(ulong)(dVar7 < 0.0) & (ulong)dVar8);
  if (local_158[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158[0]);
  }
  puVar2 = &local_78;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_38 = 0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      puVar2[lVar5] =
           (((SquareMatrix<double,_3> *)*(double (*) [3])quantityA)->
           super_RectMatrix<double,_3U,_3U>).data_[0][lVar5] * (1.0 - dVar8);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 3;
    quantityA = (SquareMatrix3<double> *)((long)quantityA + 0x18);
  } while (lVar3 != 3);
  puVar2 = &local_c8;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_88 = 0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      puVar2[lVar5] =
           (((SquareMatrix<double,_3> *)*(double (*) [3])quantityB)->
           super_RectMatrix<double,_3U,_3U>).data_[0][lVar5] * dVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 3;
    quantityB = (SquareMatrix3<double> *)((long)quantityB + 0x18);
  } while (lVar3 != 3);
  puVar2 = local_118;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[8] = 0;
  puVar4 = &local_c8;
  puVar6 = &local_78;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      puVar2[lVar5] = (double)puVar6[lVar5] + (double)puVar4[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 3;
    puVar4 = puVar4 + 3;
    puVar6 = puVar6 + 3;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_158 + lVar3 + 8) = *(undefined8 *)((long)local_118 + lVar3 + 0x10);
    uVar1 = *(undefined8 *)((long)local_118 + lVar3 + 8);
    *(undefined8 *)((long)&local_160 + lVar3) = *(undefined8 *)((long)local_118 + lVar3);
    *(undefined8 *)((long)local_158 + lVar3) = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  lVar3 = 0;
  do {
    *(undefined8 *)
     ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
            .data_[0] + lVar3 + 0x10) = *(undefined8 *)((long)local_158 + lVar3 + 8);
    uVar1 = *(undefined8 *)((long)local_158 + lVar3);
    puVar2 = (undefined8 *)
             ((long)(__return_storage_ptr__->super_SquareMatrix<double,_3>).
                    super_RectMatrix<double,_3U,_3U>.data_[0] + lVar3);
    *puVar2 = *(undefined8 *)((long)&local_160 + lVar3);
    puVar2[1] = uVar1;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

T linearCombination(T quantityA, T quantityB) {
      RealType result = f_lambda(currentSnapshot_->getSPFData()->lambda);

      return T {(1.0 - result) * quantityA + result * quantityB};
    }